

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cc
# Opt level: O1

int Bits::Difference(void *m1,void *m2,int num_bytes)

{
  int iVar1;
  long lVar2;
  uint8 *s2;
  uint8 *s1;
  
  if (0 < num_bytes) {
    lVar2 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + ""[*(byte *)((long)m2 + lVar2) ^ *(byte *)((long)m1 + lVar2)];
      lVar2 = lVar2 + 1;
    } while (num_bytes != (int)lVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int Bits::Difference(const void *m1, const void *m2, int num_bytes) {
  int nbits = 0;
  const uint8 *s1 = (const uint8 *) m1;
  const uint8 *s2 = (const uint8 *) m2;
  for (int i = 0; i < num_bytes; i++)
    nbits += num_bits[(*s1++) ^ (*s2++)];
  return nbits;
}